

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CArmInstruction.cpp
# Opt level: O3

bool __thiscall CArmInstruction::Validate(CArmInstruction *this,ValidateState *state)

{
  int *text;
  bool bVar1;
  bool bVar2;
  ExpressionValueType EVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  sbyte sVar9;
  int *in_RCX;
  int *piVar10;
  uint uVar11;
  ExpressionValue *dest;
  byte bVar12;
  ErrorType EVar13;
  char *pcVar14;
  byte bVar15;
  uint uVar16;
  uint uVar17;
  int num;
  ExpressionValue local_50;
  
  uVar8 = FileManager::getVirtualAddress(g_fileManager);
  this->RamPos = uVar8;
  (this->Vars).Opcode.UseNewEncoding = false;
  (this->Vars).Opcode.UseNewType = false;
  if ((uVar8 & 3) != 0) {
    Logger::queueError<>(Warning,"Opcode not word aligned");
  }
  if (((this->Vars).Shift.UseShift == true) && ((this->Vars).Shift.ShiftByRegister == false)) {
    bVar2 = Expression::evaluateInteger<int>
                      (&(this->Vars).Shift.ShiftExpression,&(this->Vars).Shift.ShiftAmount);
    if (bVar2) {
      bVar15 = (this->Vars).Shift.Type;
      local_50.type = (this->Vars).Shift.ShiftAmount;
      in_RCX = (int *)(ulong)local_50.type;
      bVar12 = 0;
      EVar3 = Invalid;
      if (local_50.type != Invalid || bVar15 != 1) {
        if (local_50.type == Invalid && (bVar15 & 0xfe) == 2) {
          bVar12 = 0;
          EVar3 = Invalid;
        }
        else {
          bVar12 = 1;
          EVar3 = Invalid;
          if ((local_50.type != 0x20 || bVar15 != 1) &&
             (bVar12 = 2, EVar3 = Invalid, local_50.type != 0x20 || bVar15 != 2)) {
            if (bVar15 == 0 && local_50.type == 0x20) {
LAB_00162c0d:
              EVar13 = 0x18f133;
              dest = &local_50;
              goto LAB_0016292f;
            }
            if (bVar15 == 4) {
              bVar12 = 3;
              if (local_50.type != Integer) {
                pcVar14 = "Invalid shift mode";
                goto LAB_00162940;
              }
            }
            else {
              bVar12 = bVar15;
              EVar3 = local_50.type;
              if (0x20 < local_50.type) goto LAB_00162c0d;
            }
          }
        }
      }
      (this->Vars).Shift.FinalType = bVar12;
      (this->Vars).Shift.FinalShiftAmount = EVar3;
      (this->Vars).Shift.UseFinal = true;
      goto LAB_00162817;
    }
LAB_00162939:
    pcVar14 = "Invalid expression";
LAB_00162940:
    Logger::queueError<>(Error,pcVar14);
    return false;
  }
LAB_00162817:
  uVar4 = (uint)(this->Opcode).flags;
  if ((uVar4 >> 0x16 & 1) != 0) {
    dest = (ExpressionValue *)&(this->Vars).CopData.Cpop;
    bVar2 = Expression::evaluateInteger<int>(&(this->Vars).CopData.CpopExpression,(int *)dest);
    if (!bVar2) goto LAB_00162939;
    if (0xf < *(int *)dest) {
      EVar13 = 0x18f167;
      goto LAB_0016292f;
    }
    uVar4 = (uint)(this->Opcode).flags;
  }
  if ((uVar4 >> 0x17 & 1) != 0) {
    dest = (ExpressionValue *)&(this->Vars).CopData.Cpinf;
    bVar2 = Expression::evaluateInteger<int>(&(this->Vars).CopData.CpinfExpression,(int *)dest);
    if (!bVar2) goto LAB_00162939;
    if (7 < *(int *)dest) {
      EVar13 = 0x18f182;
LAB_0016292f:
      Logger::queueError<int>((Logger *)0x1,EVar13,(char *)dest,in_RCX);
      return false;
    }
    uVar4 = (uint)(this->Opcode).flags;
  }
  if ((uVar4 >> 0x18 & 1) != 0) {
    std::__cxx11::string::_M_assign((string *)&(this->Vars).rn);
    (this->Vars).rn.num = (this->Vars).rd.num;
    uVar4 = (uint)(this->Opcode).flags;
  }
  if ((uVar4 >> 0x19 & 1) != 0) {
    std::__cxx11::string::_M_assign((string *)&(this->Vars).rm);
    (this->Vars).rm.num = (this->Vars).rd.num;
    uVar4 = (uint)(this->Opcode).flags;
  }
  if (((uVar4 >> 0x1b & 1) != 0) && (((this->Vars).rd.num & 1) != 0)) {
    pcVar14 = "rd must be even";
    goto LAB_00162940;
  }
  if ((uVar4 & 0x20) == 0) goto LAB_00162e0d;
  Expression::evaluate(&local_50,&(this->Vars).ImmediateExpression);
  if (local_50.type == Float) {
    if (((this->Opcode).flags & 0x18000) == 0) goto LAB_00162a14;
    local_50.field_1.intValue._0_4_ =
         getFloatBits((float)(double)CONCAT44(local_50.field_1.intValue._4_4_,
                                              local_50.field_1.intValue._0_4_));
LAB_0016298d:
    (this->Vars).Immediate = local_50.field_1.intValue._0_4_;
    (this->Vars).OriginalImmediate = local_50.field_1.intValue._0_4_;
    (this->Vars).negative = false;
    FileManager::advanceMemory(g_fileManager,4);
    text = &(this->Vars).OriginalImmediate;
    uVar8 = (this->Opcode).flags;
    uVar4 = (uint)uVar8;
    if ((short)uVar8 < 0) {
      (this->Vars).negative = false;
      uVar6 = (this->Vars).Immediate;
      if (((int)uVar6 < 0 & (byte)(uVar8 >> 0x11)) == 1) {
        uVar6 = -uVar6;
        (this->Vars).Immediate = uVar6;
        (this->Vars).negative = true;
      }
      if ((uVar8 >> 0x20 & 1) != 0) {
        uVar6 = (uVar6 - ((uint)this->RamPos & 0xfffffffc)) - 8;
        (this->Vars).Immediate = uVar6;
        if ((int)uVar6 < 0) {
          (this->Vars).Opcode.NewEncoding = (this->Opcode).encoding ^ 0xc00000;
          (this->Vars).Opcode.UseNewEncoding = true;
          uVar6 = -uVar6;
          (this->Vars).Immediate = uVar6;
        }
      }
      uVar17 = 0;
      uVar16 = 0;
      do {
        uVar11 = uVar17 & 0x1e;
        if (((-0x100 << (sbyte)uVar11 | 0xffffff00U >> ((byte)uVar16 & 0x1f)) & uVar6) == 0) {
          (this->Vars).Shift.ShiftAmount = uVar16;
          uVar16 = uVar6 >> (sbyte)uVar11 | uVar6 << ((byte)uVar16 & 0x1f);
          if (uVar16 != 0xffffffff) goto LAB_00162d79;
          break;
        }
        uVar11 = uVar16 + 2;
        uVar17 = uVar17 - 2;
        bVar2 = uVar16 < 0x1e;
        uVar16 = uVar11;
      } while (bVar2);
      piVar10 = (int *)(ulong)uVar11;
      if ((uVar4 >> 0x1c & 1) != 0) {
        uVar17 = (this->Opcode).encoding;
        if ((uVar4 >> 0x1d & 1) == 0) {
          if ((uVar4 >> 0x1e & 1) == 0) {
            if ((int)uVar4 < 0) {
              uVar17 = uVar17 ^ 0x200000;
            }
            else {
              if ((uVar8 >> 0x21 & 1) == 0) goto LAB_00162d22;
              uVar17 = uVar17 ^ 0xc00000;
            }
            uVar6 = -uVar6;
            goto LAB_00162d22;
          }
          uVar17 = uVar17 ^ 0x1c00000;
        }
        else {
          uVar17 = uVar17 ^ 0x400000;
        }
        uVar6 = ~uVar6;
LAB_00162d22:
        uVar16 = 0;
        uVar4 = 0;
LAB_00162d26:
        sVar9 = (sbyte)(uVar16 & 0x1e);
        if (((-0x100 << sVar9 | 0xffffff00U >> ((byte)uVar4 & 0x1f)) & uVar6) != 0)
        goto code_r0x00162d49;
        piVar10 = (int *)(ulong)(uVar16 & 0x1e);
        (this->Vars).Shift.ShiftAmount = uVar4;
        uVar16 = uVar6 >> sVar9 | uVar6 << ((byte)uVar4 & 0x1f);
        if (uVar16 != 0xffffffff) {
          (this->Vars).Opcode.NewEncoding = uVar17;
          (this->Vars).Opcode.UseNewEncoding = true;
LAB_00162d79:
          (this->Vars).Immediate = uVar16;
          goto LAB_00162d80;
        }
      }
LAB_00162dd4:
      bVar2 = true;
      Logger::queueError<int>((Logger *)0x1,0x18f1c5,(char *)text,piVar10);
      bVar1 = true;
    }
    else {
      if ((uVar4 >> 0x10 & 1) != 0) {
        uVar4 = (this->Vars).Immediate;
        bVar15 = 0;
        uVar6 = 0;
        do {
          if (((-0x100 << (bVar15 & 0x1e) | 0xffffff00U >> ((byte)uVar6 & 0x1f)) & uVar4) == 0) {
            (this->Vars).Shift.ShiftAmount = uVar6;
            uVar6 = uVar4 >> (bVar15 & 0x1e) | uVar4 << ((byte)uVar6 & 0x1f);
            if (uVar6 != 0xffffffff) {
              (this->Vars).Opcode.NewEncoding = 0x3a00000;
              goto LAB_00162c41;
            }
            break;
          }
          bVar15 = bVar15 - 2;
          bVar2 = uVar6 < 0x1e;
          uVar6 = uVar6 + 2;
        } while (bVar2);
        uVar16 = ~uVar4;
        bVar15 = 0;
        uVar6 = 0;
LAB_00162b99:
        if (((-0x100 << (bVar15 & 0x1e) | 0xffffff00U >> ((byte)uVar6 & 0x1f)) & uVar16) != 0)
        goto code_r0x00162bbd;
        (this->Vars).Shift.ShiftAmount = uVar6;
        uVar6 = uVar16 >> (bVar15 & 0x1e) | uVar16 << ((byte)uVar6 & 0x1f);
        if (uVar6 != 0xffffffff) {
          (this->Vars).Opcode.NewEncoding = 0x3e00000;
LAB_00162c41:
          (this->Vars).Opcode.NewType = '\x02';
          (this->Vars).Opcode.UseNewEncoding = true;
          (this->Vars).Opcode.UseNewType = true;
          (this->Vars).Immediate = uVar6;
          goto LAB_00162d80;
        }
        goto LAB_00162c56;
      }
      if ((uVar4 >> 0x12 & 1) == 0) {
        if ((uVar4 >> 0x13 & 1) == 0) {
          if ((uVar4 >> 0x15 & 1) == 0) {
            if (((uVar4 >> 0x11 & 1) != 0) && (iVar7 = (this->Vars).Immediate, iVar7 < 0)) {
              (this->Vars).Immediate = -iVar7;
              (this->Vars).negative = true;
            }
          }
          else if ((this->arch < AARCH_3DS) && (iVar7 = (this->Vars).Immediate, iVar7 < 0xff)) {
            iVar7 = iVar7 << 0x10;
            (this->Vars).Immediate = iVar7;
            (this->Vars).OriginalImmediate = iVar7;
          }
        }
        else {
          iVar5 = ((this->Vars).Immediate - (int)this->RamPos) + -8;
          iVar7 = -iVar5;
          if (0 < iVar5) {
            iVar7 = iVar5;
          }
          (this->Vars).Immediate = iVar5;
          bVar15 = (byte)(this->Vars).ImmediateBitLen;
          piVar10 = (int *)CONCAT71((int7)((ulong)in_RCX >> 8),bVar15);
          if (1 << (bVar15 & 0x1f) <= iVar7) {
            EVar13 = 0x18f1e4;
LAB_00162ce1:
            bVar2 = true;
            Logger::queueError<int>((Logger *)0x1,EVar13,(char *)text,piVar10);
            bVar1 = true;
            goto LAB_00162ded;
          }
        }
LAB_00162d80:
        uVar4 = (this->Vars).ImmediateBitLen;
        bVar1 = true;
        if ((uVar4 != 0x20) && (uVar6 = (uint)(this->Opcode).flags, (uVar6 >> 0x13 & 1) == 0)) {
          uVar16 = (this->Vars).Immediate;
          uVar17 = -uVar16;
          if (0 < (int)uVar16) {
            uVar17 = uVar16;
          }
          if ((uVar6 >> 0x11 & 1) == 0) {
            uVar17 = uVar16;
          }
          if (uVar17 >> ((byte)uVar4 & 0x1f) != 0) {
            bVar2 = true;
            Logger::queueError<int>((Logger *)0x1,0x18f202,(char *)text,(int *)(ulong)uVar4);
            bVar1 = true;
            goto LAB_00162ded;
          }
        }
        bVar2 = false;
      }
      else {
        uVar4 = (this->Vars).Immediate;
        if ((char)uVar8 < '\0') {
          if ((uVar4 & 1) == 0) goto LAB_00162cb8;
          pcVar14 = "Branch target must be halfword aligned";
        }
        else {
          if ((uVar4 & 3) == 0) {
LAB_00162cb8:
            uVar6 = (uVar4 - (int)this->RamPos) - 8;
            (this->Vars).Immediate = uVar6;
            uVar4 = -uVar6;
            if (0 < (int)uVar6) {
              uVar4 = uVar6;
            }
            piVar10 = (int *)(ulong)uVar4;
            if (0x1ffffff < uVar4) {
              EVar13 = 0x18ea2a;
              goto LAB_00162ce1;
            }
            goto LAB_00162d80;
          }
          pcVar14 = "Branch target must be word aligned";
        }
        bVar2 = true;
        Logger::queueError<>(Error,pcVar14);
        bVar1 = true;
      }
    }
  }
  else {
    if (local_50.type == Integer) goto LAB_0016298d;
LAB_00162a14:
    Logger::queueError<>(Error,"Invalid expression type");
    bVar2 = true;
    bVar1 = false;
  }
LAB_00162ded:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.strValue._value._M_dataplus._M_p != &local_50.strValue._value.field_2) {
    operator_delete(local_50.strValue._value._M_dataplus._M_p,
                    local_50.strValue._value.field_2._M_allocated_capacity + 1);
  }
  if (bVar2 || bVar1) {
    return false;
  }
LAB_00162e0d:
  FileManager::advanceMemory(g_fileManager,4);
  return false;
code_r0x00162d49:
  piVar10 = (int *)(ulong)(uVar4 + 2);
  uVar16 = uVar16 - 2;
  bVar2 = 0x1d < uVar4;
  uVar4 = uVar4 + 2;
  if (bVar2) goto LAB_00162dd4;
  goto LAB_00162d26;
code_r0x00162bbd:
  bVar15 = bVar15 - 2;
  bVar2 = 0x1d < uVar6;
  uVar6 = uVar6 + 2;
  if (bVar2) goto LAB_00162c56;
  goto LAB_00162b99;
LAB_00162c56:
  CArmArchitecture::addPoolValue(&Arm,&this->super_ArmOpcodeCommand,uVar4);
  goto LAB_00162d80;
}

Assistant:

bool CArmInstruction::Validate(const ValidateState &state)
{
	RamPos = g_fileManager->getVirtualAddress();

	Vars.Opcode.UseNewEncoding = false;
	Vars.Opcode.UseNewType = false;


	if (RamPos & 3)
	{
		Logger::queueError(Logger::Warning, "Opcode not word aligned");
	}

	if (Vars.Shift.UseShift && !Vars.Shift.ShiftByRegister)
	{
		if (!Vars.Shift.ShiftExpression.evaluateInteger(Vars.Shift.ShiftAmount))
		{
			Logger::queueError(Logger::Error, "Invalid expression");
			return false;
		}

		int mode = Vars.Shift.Type;
		int num = Vars.Shift.ShiftAmount;

		if (num == 0 && mode == ARM_SHIFT_LSR) mode = ARM_SHIFT_LSL;
		else if (num == 0 && mode == ARM_SHIFT_ASR) mode = ARM_SHIFT_LSL;
		else if (num == 0 && mode == ARM_SHIFT_ROR) mode = ARM_SHIFT_LSL;
		else if (num == 32 && mode == ARM_SHIFT_LSR) num = 0;
		else if (num == 32 && mode == ARM_SHIFT_ASR) num = 0;
		else if (num == 32 && mode == ARM_SHIFT_LSL)
		{
			Logger::queueError(Logger::Error, "Shift amount 0x%02X out of range",num);
			return false;
		} else if (mode == ARM_SHIFT_RRX)
		{
			if (num != 1)
			{
				Logger::queueError(Logger::Error, "Invalid shift mode");
				return false;
			}
			mode = ARM_SHIFT_ROR;
			num = 0;
		}

		if (num > 32 || num < 0)
		{
			Logger::queueError(Logger::Error, "Shift amount 0x%02X out of range",num);
			return false;
		}

		Vars.Shift.FinalType = mode;
		Vars.Shift.FinalShiftAmount = num;
		Vars.Shift.UseFinal = true;
	}

	if (Opcode.flags & ARM_COPOP)
	{
		if (!Vars.CopData.CpopExpression.evaluateInteger(Vars.CopData.Cpop))
		{
			Logger::queueError(Logger::Error, "Invalid expression");
			return false;
		}

		if (Vars.CopData.Cpop > 15)
		{
			Logger::queueError(Logger::Error, "CP Opc number %02X too big",Vars.CopData.Cpop);
			return false;
		}
	}

	if (Opcode.flags & ARM_COPINF)
	{
		if (!Vars.CopData.CpinfExpression.evaluateInteger(Vars.CopData.Cpinf))
		{
			Logger::queueError(Logger::Error, "Invalid expression");
			return false;
		}

		if (Vars.CopData.Cpinf > 7)
		{
			Logger::queueError(Logger::Error, "CP Inf number %02X too big",Vars.CopData.Cpinf);
			return false;
		}
	}

	if (Opcode.flags & ARM_DN)
	{
		Vars.rn = Vars.rd;
	}

	if (Opcode.flags & ARM_DM)
	{
		Vars.rm = Vars.rd;
	}

	if (Opcode.flags & ARM_RDEVEN)
	{
		if (Vars.rd.num & 1)
		{
			Logger::queueError(Logger::Error, "rd must be even");
			return false;
		}
	}

	bool memoryAdvanced = false;
	if (Opcode.flags & ARM_IMMEDIATE)
	{
		ExpressionValue value = Vars.ImmediateExpression.evaluate();

		switch (value.type)
		{
		case ExpressionValueType::Integer:
			Vars.Immediate = (int) value.intValue;
			break;
		case ExpressionValueType::Float:
			if (!(Opcode.flags & ARM_SHIFT) && !(Opcode.flags & ARM_POOL))
			{
				Logger::queueError(Logger::Error, "Invalid expression type");
				return false;
			}

			Vars.Immediate = (int) getFloatBits((float)value.floatValue);
			break;
		default:
			Logger::queueError(Logger::Error, "Invalid expression type");
			return false;
		}

		Vars.OriginalImmediate = Vars.Immediate;
		Vars.negative = false;
		
		g_fileManager->advanceMemory(4);
		memoryAdvanced = true;

		if (Opcode.flags & ARM_SHIFT)	// shifted immediate, eg 4000h
		{
			int temp;
			Vars.negative = false;
			if ((Opcode.flags & ARM_ABS) && Vars.Immediate < 0)
			{
				Vars.Immediate = abs(Vars.Immediate);
				Vars.negative = true;
			}

			if (Opcode.flags & ARM_PCR)
			{
				Vars.Immediate = Vars.Immediate - ((RamPos+8) & ~3);
				if (Vars.Immediate < 0)
				{
					Vars.Opcode.NewEncoding = Opcode.encoding ^ 0xC00000;
					Vars.Opcode.UseNewEncoding = true;
					Vars.Immediate = abs(Vars.Immediate);
				}
			}

			if ((temp = getShiftedImmediate(Vars.Immediate,Vars.Shift.ShiftAmount)) == -1)
			{
				// mov/mvn -> mvn/mov
				if ((Opcode.flags & ARM_OPTIMIZE))
				{
					auto encoding = Opcode.encoding;
					auto immediate = Vars.Immediate;

					if (Opcode.flags & ARM_OPMOVMVN)
					{
						encoding ^= 0x0400000;
						immediate = ~immediate;
					}
					else if (Opcode.flags & ARM_OPANDBIC)
					{
						encoding ^= 0x1C00000;
						immediate = ~immediate;
					}
					else if (Opcode.flags & ARM_OPCMPCMN)
					{
						encoding ^= 0x0200000;
						immediate = 0-immediate;
					}
					else if (Opcode.flags & ARM_OPADDSUB)
					{
						encoding ^= 0x0C00000;
						immediate = 0-immediate;
					}

					temp = getShiftedImmediate(immediate, Vars.Shift.ShiftAmount);
					if (temp != -1)
					{
						Vars.Opcode.NewEncoding = encoding;
						Vars.Opcode.UseNewEncoding = true;
					}
				}
				if (temp == -1)
				{
					// If we get here then the instruction did not contain a shifted immediate
					// and we failed to optimize into another instruction
					Logger::queueError(Logger::Error, "Invalid shifted immediate 0x%X", Vars.OriginalImmediate);
					return false;
				}
			}
			Vars.Immediate = temp;
		} else if (Opcode.flags & ARM_POOL)
		{
			int temp;

			if ((temp = getShiftedImmediate(Vars.Immediate,Vars.Shift.ShiftAmount)) != -1)
			{
				// interpete ldr= as mov
				Vars.Opcode.NewEncoding = 0x03A00000;
				Vars.Opcode.UseNewEncoding = true;
				Vars.Opcode.NewType = ARM_TYPE5;
				Vars.Opcode.UseNewType = true;
				Vars.Immediate = temp;
			} else if ((temp = getShiftedImmediate(~Vars.Immediate,Vars.Shift.ShiftAmount)) != -1) 
			{
				// interprete ldr= as mvn
				Vars.Opcode.NewEncoding = 0x03E00000;
				Vars.Opcode.UseNewEncoding = true;
				Vars.Opcode.NewType = ARM_TYPE5;
				Vars.Opcode.UseNewType = true;
				Vars.Immediate = temp;
			} else {
				Arm.addPoolValue(this,Vars.Immediate);
			}
		} else if (Opcode.flags & ARM_BRANCH)
		{
			if (Opcode.flags & ARM_HALFWORD)
			{
				if (Vars.Immediate & 1)
				{
					Logger::queueError(Logger::Error, "Branch target must be halfword aligned");
					return false;
				}
			} else {
				if (Vars.Immediate & 3)
				{
					Logger::queueError(Logger::Error, "Branch target must be word aligned");
					return false;
				}
			}

			Vars.Immediate = (int) (Vars.Immediate-RamPos-8);
			if (abs(Vars.Immediate) >= 0x2000000)
			{
				Logger::queueError(Logger::Error, "Branch target %08X out of range",Vars.OriginalImmediate);
				return false;
			}
		} else if (Opcode.flags & ARM_ABSIMM)	// ldr r0,[I]
		{
			Vars.Immediate = (int) (Vars.Immediate-RamPos-8);
			if (abs(Vars.Immediate) >= (1 << Vars.ImmediateBitLen))
			{
				Logger::queueError(Logger::Error, "Load target %08X out of range",Vars.OriginalImmediate);
				return false;
			}
		} else if (Opcode.flags & ARM_SWI)	// it's an interrupt, may need to shift it
		{
			bool needsShift = arch == AARCH_GBA || arch == AARCH_NDS;
			if (needsShift && Vars.Immediate < 0xFF)
			{
				Vars.Immediate <<= 16;
				Vars.OriginalImmediate = Vars.Immediate;
			}
		} else if ((Opcode.flags & ARM_ABS) && Vars.Immediate < 0)
		{
			Vars.Immediate = abs(Vars.Immediate);
			Vars.negative = true;
		}

		if (Vars.ImmediateBitLen != 32 && !(Opcode.flags & ARM_ABSIMM))
		{
			unsigned int check = Opcode.flags & ARM_ABS ? abs(Vars.Immediate) : Vars.Immediate;
			if (check >= (unsigned int)(1 << Vars.ImmediateBitLen))
			{
				Logger::queueError(Logger::Error, "Immediate value %X out of range",Vars.OriginalImmediate);
				return false;
			}
		}
	}
	
	if (!memoryAdvanced)
		g_fileManager->advanceMemory(4);

	return false;
}